

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O1

Query * q_optimize(Query *__return_storage_ptr__,Query *q)

{
  PrimitiveQuery *pPVar1;
  pointer pQVar2;
  pointer pQVar3;
  QueryType *pQVar4;
  bool changed;
  bool local_a9;
  vector<QToken,_std::allocator<QToken>_> local_a8;
  Query local_90;
  vector<Query,_std::allocator<Query>_> *local_48;
  QString *local_40;
  Query *local_38;
  
  pQVar4 = Query::get_type(q);
  if (*pQVar4 == PRIMITIVE) {
    __return_storage_ptr__->type = q->type;
    pQVar2 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar2;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->count = q->count;
    __return_storage_ptr__->ngram = q->ngram;
    pQVar3 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar3;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
  }
  else {
    local_38 = __return_storage_ptr__;
    simplify_subqueries(&local_90,q);
    q->type = local_90.type;
    local_40 = &q->value;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
               super__Vector_impl_data._M_start;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_a8);
    pPVar1 = &q->ngram;
    q->count = local_90.count;
    q->ngram = local_90.ngram;
    local_48 = &q->queries;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_start;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Query,_std::allocator<Query>_>::~vector
              ((vector<Query,_std::allocator<Query>_> *)&local_a8);
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_90.queries);
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_90.value);
    do {
      local_a9 = false;
      flatten_trivial_operations(&local_90,q,&local_a9);
      q->type = local_90.type;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_a8);
      q->count = local_90.count;
      *pPVar1 = local_90.ngram;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                          super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Query,_std::allocator<Query>_>::~vector
                ((vector<Query,_std::allocator<Query>_> *)&local_a8);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_90.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_90.value);
      inline_suboperations(&local_90,q,&local_a9);
      q->type = local_90.type;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_a8);
      q->count = local_90.count;
      *pPVar1 = local_90.ngram;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                          super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Query,_std::allocator<Query>_>::~vector
                ((vector<Query,_std::allocator<Query>_> *)&local_a8);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_90.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_90.value);
      deduplicate_primitives(&local_90,q,&local_a9);
      q->type = local_90.type;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_a8);
      q->count = local_90.count;
      *pPVar1 = local_90.ngram;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                          super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Query,_std::allocator<Query>_>::~vector
                ((vector<Query,_std::allocator<Query>_> *)&local_a8);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_90.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_90.value);
      simplify_minof(&local_90,q,&local_a9);
      q->type = local_90.type;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_a8);
      q->count = local_90.count;
      *pPVar1 = local_90.ngram;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                          super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Query,_std::allocator<Query>_>::~vector
                ((vector<Query,_std::allocator<Query>_> *)&local_a8);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_90.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_90.value);
      propagate_degenerate_queries(&local_90,q,&local_a9);
      q->type = local_90.type;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_a8);
      q->count = local_90.count;
      *pPVar1 = local_90.ngram;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                          super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_start = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Query,_std::allocator<Query>_>::~vector
                ((vector<Query,_std::allocator<Query>_> *)&local_a8);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_90.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_90.value);
    } while (local_a9 != false);
    reorder_subqueries(&local_90,q);
    q->type = local_90.type;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
               super__Vector_impl_data._M_start;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_a8);
    q->count = local_90.count;
    *pPVar1 = local_90.ngram;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_start;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Query,_std::allocator<Query>_>::~vector
              ((vector<Query,_std::allocator<Query>_> *)&local_a8);
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_90.queries);
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_90.value);
    local_38->type = q->type;
    pQVar2 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (local_38->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_38->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar2;
    (local_38->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (local_40->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (local_40->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38->count = q->count;
    local_38->ngram = *pPVar1;
    pQVar3 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (local_38->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_38->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar3;
    (local_38->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (local_48->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_48->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (local_48->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__ = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

Query q_optimize(Query &&q) {
    if (q.get_type() == QueryType::PRIMITIVE) {
        // Nothing to improve here.
        return std::move(q);
    }

    q = simplify_subqueries(std::move(q));
    bool changed = true;
    while (changed) {
        changed = false;
        q = flatten_trivial_operations(std::move(q), &changed);
        q = inline_suboperations(std::move(q), &changed);
        q = deduplicate_primitives(std::move(q), &changed);
        q = simplify_minof(std::move(q), &changed);
        q = propagate_degenerate_queries(std::move(q), &changed);
    }
    q = reorder_subqueries(std::move(q));
    return std::move(q);
}